

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
Button::writeXml_abi_cxx11_(string *__return_storage_ptr__,Button *this,int indent)

{
  ostream *poVar1;
  int level;
  int level_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  stringstream str;
  string sStack_388;
  string local_368;
  string local_348 [32];
  string local_328;
  string local_308 [32];
  string local_2e8;
  string local_2c8 [32];
  string local_2a8;
  string local_288 [32];
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(&sStack_388,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_198,(string *)&sStack_388);
  std::operator<<(poVar1,"<Button");
  std::__cxx11::string::~string((string *)&sStack_388);
  std::__cxx11::string::string((string *)&local_268,"isTextButton",(allocator *)&sStack_388);
  Util::writeXmlAttribute<bool>(&local_1c8,(stringstream *)local_1a8,&local_268,this->isTextButton);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::string(local_288,"text",(allocator *)&sStack_388);
  std::__cxx11::string::string((string *)&local_2a8,(string *)&this->text);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_1e8,(Util *)local_1a8,(stringstream *)local_288,&local_2a8,in_R8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::string(local_2c8,"backgroundNormalImage",(allocator *)&sStack_388);
  std::__cxx11::string::string((string *)&local_2e8,(string *)&this->backgroundNormalImage);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_208,(Util *)local_1a8,(stringstream *)local_2c8,&local_2e8,in_R8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::string(local_308,"backgroundPressedImage",(allocator *)&sStack_388);
  std::__cxx11::string::string((string *)&local_328,(string *)&this->backgroundPressedImage);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_228,(Util *)local_1a8,(stringstream *)local_308,&local_328,in_R8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::string(local_348,"backgroundDisabledImage",(allocator *)&sStack_388);
  std::__cxx11::string::string((string *)&local_368,(string *)&this->backgroundDisabledImage);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_248,(Util *)local_1a8,(stringstream *)local_348,&local_368,in_R8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string(local_348);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1a8);
  if ((this->super_Widget).numChildren == 0) {
    std::operator<<(local_198,"/>");
  }
  else {
    poVar1 = std::operator<<(local_198,">");
    std::endl<char,std::char_traits<char>>(poVar1);
    Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1a8,indent + 1);
    Util::getIndent_abi_cxx11_(&sStack_388,(Util *)(ulong)(uint)indent,level_00);
    poVar1 = std::operator<<(local_198,(string *)&sStack_388);
    std::operator<<(poVar1,"</Button>");
    std::__cxx11::string::~string((string *)&sStack_388);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Button::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Button";
	Util::writeXmlAttribute(str, "isTextButton", isTextButton);
	Util::writeXmlAttribute(str, "text", text);
	Util::writeXmlAttribute(str, "backgroundNormalImage", backgroundNormalImage);
	Util::writeXmlAttribute(str, "backgroundPressedImage", backgroundPressedImage);
	Util::writeXmlAttribute(str, "backgroundDisabledImage", backgroundDisabledImage);
	writeXmlAttributes(str);

	if (numChildren == 0)
		str << "/>";
	else
	{
		str << ">" << std::endl;

		Widget::writeXmlChildren(str, indent + 1);

		str << Util::getIndent(indent) << "</Button>";
	}

	return str.str();
}